

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.cpp
# Opt level: O1

void __thiscall helics::CallbackFederate::loadOperator(CallbackFederate *this)

{
  undefined4 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_int *p_Var2;
  long *plVar3;
  undefined1 uVar4;
  undefined8 *puVar5;
  CallbackFederateOperator *__tmp;
  undefined8 local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  puVar5 = (undefined8 *)operator_new(0x20);
  puVar5[1] = 0x100000001;
  *puVar5 = &PTR___Sp_counted_ptr_inplace_00558fc0;
  puVar5[2] = &PTR__FederateOperator_00559010;
  puVar5[3] = this;
  *(undefined8 **)&(this->super_CombinationFederate).super_ValueFederate.field_0x20 = puVar5 + 2;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             &(this->super_CombinationFederate).super_ValueFederate.field_0x28;
  *(undefined8 **)&(this->super_CombinationFederate).super_ValueFederate.field_0x28 = puVar5;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  local_38 = *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x20;
  p_Var2 = (this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate[-3];
  plVar3 = *(long **)(&(this->super_CombinationFederate).super_ValueFederate.field_0x18 +
                     (long)p_Var2);
  uVar1 = *(undefined4 *)
           (&(this->super_CombinationFederate).super_ValueFederate.field_0x10 + (long)p_Var2);
  local_30 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              &(this->super_CombinationFederate).super_ValueFederate.field_0x28;
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_30->_M_use_count = local_30->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_30->_M_use_count = local_30->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar3 + 0x2b0))(plVar3,uVar1,&local_38);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  p_Var2 = (this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate[-3];
  plVar3 = *(long **)(&(this->super_CombinationFederate).super_ValueFederate.field_0x18 +
                     (long)p_Var2);
  (**(code **)(*plVar3 + 0x110))
            (plVar3,*(undefined4 *)
                     (&(this->super_CombinationFederate).super_ValueFederate.field_0x10 +
                     (long)p_Var2),0x67,1);
  p_Var2 = (this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate[-3];
  plVar3 = *(long **)(&(this->super_CombinationFederate).super_ValueFederate.field_0x18 +
                     (long)p_Var2);
  uVar4 = (**(code **)(*plVar3 + 0x118))
                    (plVar3,*(undefined4 *)
                             (&(this->super_CombinationFederate).super_ValueFederate.field_0x10 +
                             (long)p_Var2),0x51);
  (this->super_CombinationFederate).super_ValueFederate.field_0x30 = uVar4;
  local_28._8_8_ = 0;
  pcStack_10 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/CallbackFederate.cpp:91:19)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/CallbackFederate.cpp:91:19)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  Federate::setAsyncCheck
            ((Federate *)
             ((long)&(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate +
             (long)(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate[-3]),
             (function<bool_()> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void CallbackFederate::loadOperator()
{
    op = std::make_shared<CallbackFederateOperator>(this);
    coreObject->setFederateOperator(getID(), op);
    coreObject->setFlagOption(getID(), HELICS_FLAG_CALLBACK_FEDERATE, true);
    mEventTriggered = coreObject->getFlagOption(getID(), HELICS_FLAG_EVENT_TRIGGERED);
    setAsyncCheck([this]() { return (getCurrentMode() >= Modes::FINALIZE); });
}